

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

void anon_unknown.dwarf_c91b1::ClearLoadStoreInfoGlobal(VmModule *module)

{
  uint uVar1;
  LoadStoreInfo *pLVar2;
  LoadStoreInfo *__dest;
  bool local_2a;
  bool local_29;
  bool local_22;
  bool local_21;
  bool hasStoreToGlobal;
  bool hasLoadFromGlobal;
  LoadStoreInfo *el;
  uint i;
  VmModule *module_local;
  
  el._4_4_ = 0;
  while( true ) {
    uVar1 = SmallArray<VmModule::LoadStoreInfo,_32U>::size(&module->loadStoreInfo);
    if (uVar1 <= el._4_4_) break;
    pLVar2 = SmallArray<VmModule::LoadStoreInfo,_32U>::operator[](&module->loadStoreInfo,el._4_4_);
    local_29 = false;
    if ((pLVar2->loadAddress != (VmConstant *)0x0) &&
       (local_29 = false, pLVar2->loadAddress->container != (VariableData *)0x0)) {
      local_29 = IsGlobalScope(pLVar2->loadAddress->container->scope);
    }
    local_21 = local_29;
    local_2a = false;
    if ((pLVar2->storeAddress != (VmConstant *)0x0) &&
       (local_2a = false, pLVar2->storeAddress->container != (VariableData *)0x0)) {
      local_2a = IsGlobalScope(pLVar2->storeAddress->container->scope);
    }
    local_22 = local_2a;
    if (((local_29 != false) && ((pLVar2->noLoadOrNoContainerAlias & 1U) != 0)) &&
       ((pLVar2->loadAddress->container->isAlloca & 1U) != 0)) {
      local_21 = false;
    }
    if (((local_2a != false) && ((pLVar2->noStoreOrNoContainerAlias & 1U) != 0)) &&
       ((pLVar2->storeAddress->container->isAlloca & 1U) != 0)) {
      local_22 = false;
    }
    if ((local_21 == false) && (local_22 == false)) {
      el._4_4_ = el._4_4_ + 1;
    }
    else {
      pLVar2 = SmallArray<VmModule::LoadStoreInfo,_32U>::back(&module->loadStoreInfo);
      __dest = SmallArray<VmModule::LoadStoreInfo,_32U>::operator[](&module->loadStoreInfo,el._4_4_)
      ;
      memcpy(__dest,pLVar2,0x52);
      SmallArray<VmModule::LoadStoreInfo,_32U>::pop_back(&module->loadStoreInfo);
    }
  }
  return;
}

Assistant:

void ClearLoadStoreInfoGlobal(VmModule *module)
	{
		for(unsigned i = 0; i < module->loadStoreInfo.size();)
		{
			VmModule::LoadStoreInfo &el = module->loadStoreInfo[i];

			bool hasLoadFromGlobal = el.loadAddress && el.loadAddress->container && IsGlobalScope(el.loadAddress->container->scope);
			bool hasStoreToGlobal = el.storeAddress && el.storeAddress->container && IsGlobalScope(el.storeAddress->container->scope);

			// If this is an alloca temporary and it cannot be aliased, we can remove it even in the global scope
			if(hasLoadFromGlobal && el.noLoadOrNoContainerAlias && el.loadAddress->container->isAlloca)
				hasLoadFromGlobal = false;

			if(hasStoreToGlobal && el.noStoreOrNoContainerAlias && el.storeAddress->container->isAlloca)
				hasStoreToGlobal = false;

			if(hasLoadFromGlobal || hasStoreToGlobal)
			{
				module->loadStoreInfo[i] = module->loadStoreInfo.back();
				module->loadStoreInfo.pop_back();
			}
			else
			{
				i++;
				continue;
			}
		}
	}